

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O3

void verify_equal(char *input,size_t size,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  size_type __size;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  int extraout_EDX;
  zlib_wrapper type;
  pointer __s1;
  string sStack_50;
  
  if (output->_M_string_length == 0) {
    __s1 = (pointer)0x0;
  }
  else {
    __s1 = (output->_M_dataplus)._M_p;
  }
  if (output->_M_string_length == size) {
    iVar4 = bcmp(__s1,input,size);
    if (iVar4 == 0) {
      return;
    }
  }
  type = (zlib_wrapper)input;
  verify_equal();
  pcVar5 = zlib_wrapper_name(type);
  iVar4 = zlib_compression_level;
  pcVar6 = zlib_level_strategy_name(zlib_compression_level);
  printf("%s %d %s%s\n",pcVar5,(ulong)(uint)iVar4,pcVar6,*(undefined8 *)(__s1 + 0x10));
  paVar1 = &sStack_50.field_2;
  sStack_50._M_string_length = 0;
  sStack_50.field_2._M_local_buf[0] = '\0';
  sStack_50._M_dataplus._M_p = (pointer)paVar1;
  zlib_compress(type,*(char **)__s1,*(size_t *)(__s1 + 8),&sStack_50,true);
  uVar7 = crc32_z(0,0,0);
  _Var3._M_p = sStack_50._M_dataplus._M_p;
  uVar7 = crc32_z(uVar7,sStack_50._M_dataplus._M_p,sStack_50._M_string_length);
  __size = sStack_50._M_string_length;
  printf("data crc32 %.8lx length %zu\n",uVar7,sStack_50._M_string_length);
  if (type == kWrapperZLIB) {
    uVar2 = *(uint *)(_Var3._M_p + (__size - 4));
    printf("zlib adler %.8x\n",
           (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18))
    ;
  }
  else if (type == kWrapperGZIP) {
    printf("gzip crc32 %.8x length %u\n",(ulong)*(uint *)(_Var3._M_p + (__size - 8)),
           (ulong)*(uint *)(_Var3._M_p + (__size - 4)));
  }
  if (extraout_EDX == 2) {
    fwrite(sStack_50._M_dataplus._M_p,__size,1,_stdout);
  }
  fflush(_stdout);
  iVar4 = ferror(_stdout);
  if (iVar4 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p,
                      CONCAT71(sStack_50.field_2._M_allocated_capacity._1_7_,
                               sStack_50.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  check_file();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_50._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_50._M_dataplus._M_p,
                    CONCAT71(sStack_50.field_2._M_allocated_capacity._1_7_,
                             sStack_50.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void verify_equal(const char* input, size_t size, std::string* output) {
  const char* data = string_data(output);
  if (output->size() == size && !memcmp(data, input, size))
    return;
  fprintf(stderr, "uncompressed data does not match the input data\n");
  exit(3);
}